

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O3

string * __thiscall Ratio::toString_abi_cxx11_(string *__return_storage_ptr__,Ratio *this)

{
  pointer pPVar1;
  Ratio *this_00;
  ostream *poVar2;
  PhyloTreeEdge *e;
  pointer pPVar3;
  double dVar4;
  ostringstream ss;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  Ratio *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pPVar3 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1b0 = this;
  if (pPVar3 != pPVar1) {
    do {
      (**(pPVar3->super_Bipartition)._vptr_Bipartition)(&local_1d0,pPVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0,local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar1);
  }
  this_00 = local_1b0;
  dVar4 = getELength(local_1b0);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," / ",3);
  dVar4 = getFLength(this_00);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  pPVar3 = (this_00->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this_00->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pPVar3 != pPVar1) {
    do {
      (**(pPVar3->super_Bipartition)._vptr_Bipartition)(&local_1d0,pPVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0,local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string Ratio::toString() {
    std::ostringstream ss;
    for (auto &e : eEdges) {
        ss << e.toString() << " ";
    }
    ss << getELength() << " / " << getFLength() << " ";
    for (auto &f : fEdges) {
        ss << f.toString() << " ";
    }

    return ss.str();
}